

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DecoratorGradient.cpp
# Opt level: O0

bool __thiscall
Rml::DecoratorConicGradient::Initialise
          (DecoratorConicGradient *this,bool in_repeating,float in_angle,Vector2Numeric in_position,
          ColorStopList *in_color_stops)

{
  bool bVar1;
  ColorStopList *in_color_stops_local;
  float in_angle_local;
  bool in_repeating_local;
  DecoratorConicGradient *this_local;
  Vector2Numeric in_position_local;
  
  this->repeating = in_repeating;
  this->angle = in_angle;
  (this->position).x = in_position.x;
  (this->position).y = in_position.y;
  ::std::vector<Rml::ColorStop,_std::allocator<Rml::ColorStop>_>::operator=
            (&this->color_stops,in_color_stops);
  bVar1 = ::std::vector<Rml::ColorStop,_std::allocator<Rml::ColorStop>_>::empty(&this->color_stops);
  return (bool)((bVar1 ^ 0xffU) & 1);
}

Assistant:

bool DecoratorConicGradient::Initialise(bool in_repeating, float in_angle, Vector2Numeric in_position, const ColorStopList& in_color_stops)
{
	repeating = in_repeating;
	angle = in_angle;
	position = in_position;
	color_stops = in_color_stops;
	return !color_stops.empty();
}